

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

BlockStatement * slang::ast::BlockStatement::makeEmpty(Compilation *compilation)

{
  StatementList *args;
  BlockStatement *pBVar1;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> local_48;
  SourceRange local_30;
  
  local_48._M_ptr = (pointer)0x0;
  local_48._M_extent._M_extent_value = 0;
  local_30.startLoc = (SourceLocation)0xffffffffffffffff;
  local_30.endLoc = (SourceLocation)0xffffffffffffffff;
  args = BumpAllocator::
         emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*const,18446744073709551615ul>,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_48,&local_30);
  local_30.startLoc = (SourceLocation)((ulong)local_30.startLoc & 0xffffffff00000000);
  local_48._M_ptr = (pointer)0xffffffffffffffff;
  local_48._M_extent._M_extent_value = 0xffffffffffffffff;
  pBVar1 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement&,slang::ast::StatementBlockKind,slang::SourceRange>
                     (&compilation->super_BumpAllocator,&args->super_Statement,
                      (StatementBlockKind *)&local_30,(SourceRange *)&local_48);
  return pBVar1;
}

Assistant:

BlockStatement& BlockStatement::makeEmpty(Compilation& compilation) {
    return *compilation.emplace<BlockStatement>(
        StatementList::makeEmpty(compilation), StatementBlockKind::Sequential,
        SourceRange(SourceLocation::NoLocation, SourceLocation::NoLocation));
}